

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O2

node * __thiscall
sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
::load(LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
       *this,locType *offset)

{
  CacheNode *pCVar1;
  CacheNode *pCVar2;
  Node *pNVar3;
  CacheNode *this_00;
  CacheNode *pCVar4;
  CacheNode **ppCVar5;
  node local_660;
  
  this->attempt_count = this->attempt_count + 1;
  pNVar3 = map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
           ::search(&this->table,offset);
  if (pNVar3 == (this->table).nil) {
    this->miss_count = this->miss_count + 1;
    this_00 = (CacheNode *)operator_new(0x670);
    f_read(&local_660,this,offset);
    CacheNode::CacheNode(this_00,&local_660,offset,this);
    if (this->block_lim == (this->table).tot) {
      pCVar4 = this->tail;
      pCVar1 = pCVar4->prec;
      ppCVar5 = &pCVar1->succ;
      if (pCVar1 == (CacheNode *)0x0) {
        ppCVar5 = &this->head;
      }
      this->tail = pCVar1;
      *ppCVar5 = (CacheNode *)0x0;
      CacheNode::~CacheNode(pCVar4);
      operator_delete(pCVar4,0x670);
    }
    pCVar4 = this->head;
    if (pCVar4 == (CacheNode *)0x0) {
      this->tail = this_00;
      goto LAB_0010fb5d;
    }
  }
  else {
    this_00 = pNVar3->value->second;
    pCVar4 = this->head;
    if (this_00 == pCVar4) {
      return &this_00->value;
    }
    pCVar1 = this_00->prec;
    pCVar2 = this_00->succ;
    pCVar1->succ = pCVar2;
    ppCVar5 = &pCVar2->prec;
    if (pCVar2 == (CacheNode *)0x0) {
      ppCVar5 = &this->tail;
    }
    *ppCVar5 = pCVar1;
    this_00->prec = (CacheNode *)0x0;
  }
  this_00->succ = pCVar4;
  pCVar4->prec = this_00;
LAB_0010fb5d:
  this->head = this_00;
  return &this_00->value;
}

Assistant:

valueType *load(const locType &offset)
		{
			++ attempt_count;
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			CacheNode *node;
			if (it == table.end())
			{
				++ miss_count;
				node = new CacheNode (f_read(offset) , offset , this);
				if (block_lim == table.size())
				{
					CacheNode *tmp = tail;
					if (tail = tail -> prec) tail -> succ = nullptr;
					else  head = nullptr;
					delete tmp;
				}
				if (head == nullptr) head = tail = node;
				else (node -> succ = head) -> prec = node , head = node;
			}
			else
			{
				node = it -> second;
				if (node != head)
				{
					node -> prec -> succ = node -> succ;
					if (node -> succ) node -> succ -> prec = node -> prec;
					else tail = node -> prec;
					node -> prec = nullptr , (node -> succ = head) -> prec = node , head = node;
				}
			}
			return &(node -> value);
		}